

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::hufPackEncTable(longlong *hcode,int im,int iM,char **pcode)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  
  pcVar7 = *pcode;
  if (im <= iM) {
    uVar6 = 0;
    uVar8 = 0;
    do {
      lVar9 = (long)im;
      puVar1 = (ulong *)(hcode + lVar9);
      iVar2 = (int)uVar6;
      iVar3 = im;
      if (im < iM && (*puVar1 & 0x3f) == 0) {
        uVar5 = 1;
        while (uVar4 = uVar5, (*(byte *)(hcode + lVar9 + 1) & 0x3f) == 0) {
          lVar9 = lVar9 + 1;
          uVar4 = uVar5 + 1;
          if ((iM <= lVar9) || (bVar10 = 0x103 < uVar5, uVar5 = uVar4, bVar10)) break;
        }
        iVar3 = (int)lVar9;
        if (uVar4 < 2) goto LAB_00124db2;
        if (uVar4 < 6) {
          uVar8 = uVar8 << 6 | (ulong)(uVar4 + 0x39);
          if (1 < iVar2) {
            uVar6 = (ulong)(iVar2 + 6);
            do {
              uVar6 = uVar6 - 8;
              *pcVar7 = (char)((long)uVar8 >> ((byte)uVar6 & 0x3f));
              pcVar7 = pcVar7 + 1;
            } while (7 < uVar6);
            goto LAB_00124e5d;
          }
          goto LAB_00124e5a;
        }
        uVar6 = uVar8 << 6 | 0x3f;
        if (iVar2 < 2) {
          uVar8 = uVar6 << 8 | (ulong)(uVar4 - 6);
          uVar5 = iVar2 + 0xe;
          uVar6 = (ulong)uVar5;
          if ((int)(iVar2 + 6U) < 0) goto LAB_00124e5d;
        }
        else {
          uVar8 = (ulong)(iVar2 + 6U);
          uVar5 = iVar2 + 0xe;
          do {
            uVar8 = uVar8 - 8;
            *pcVar7 = (char)((long)uVar6 >> ((byte)uVar8 & 0x3f));
            pcVar7 = pcVar7 + 1;
            uVar5 = uVar5 - 8;
          } while (7 < uVar8);
          uVar8 = uVar6 << 8 | (ulong)(uVar4 - 6);
        }
        uVar6 = (ulong)uVar5;
        do {
          uVar6 = uVar6 - 8;
          *pcVar7 = (char)((long)uVar8 >> ((byte)uVar6 & 0x3f));
          pcVar7 = pcVar7 + 1;
        } while (7 < uVar6);
      }
      else {
LAB_00124db2:
        uVar8 = uVar8 << 6 | *puVar1 & 0x3f;
        if (iVar2 < 2) {
LAB_00124e5a:
          uVar6 = (ulong)(iVar2 + 6);
        }
        else {
          uVar6 = (ulong)(iVar2 + 6);
          do {
            uVar6 = uVar6 - 8;
            *pcVar7 = (char)((long)uVar8 >> ((byte)uVar6 & 0x3f));
            pcVar7 = pcVar7 + 1;
          } while (7 < uVar6);
        }
      }
LAB_00124e5d:
      im = iVar3 + 1;
    } while (iVar3 < iM);
    if (0 < (int)uVar6) {
      *pcVar7 = (char)(uVar8 << (8U - (char)uVar6 & 0x3f));
      pcVar7 = pcVar7 + 1;
    }
  }
  *pcode = pcVar7;
  return;
}

Assistant:

void hufPackEncTable(
    const long long *hcode,  // i : encoding table [HUF_ENCSIZE]
    int im,                  // i : min hcode index
    int iM,                  // i : max hcode index
    char **pcode)            //  o: ptr to packed table (updated)
{
  char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    int l = hufLength(hcode[im]);

    if (l == 0) {
      int zerun = 1;

      while ((im < iM) && (zerun < LONGEST_LONG_RUN)) {
        if (hufLength(hcode[im + 1]) > 0) break;
        im++;
        zerun++;
      }

      if (zerun >= 2) {
        if (zerun >= SHORTEST_LONG_RUN) {
          outputBits(6, LONG_ZEROCODE_RUN, c, lc, p);
          outputBits(8, zerun - SHORTEST_LONG_RUN, c, lc, p);
        } else {
          outputBits(6, SHORT_ZEROCODE_RUN + zerun - 2, c, lc, p);
        }
        continue;
      }
    }

    outputBits(6, l, c, lc, p);
  }

  if (lc > 0) *p++ = (unsigned char)(c << (8 - lc));

  *pcode = p;
}